

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void character_cast_spell(void *character_void)

{
  ESF_Data *pEVar1;
  
  if (*(long *)((long)character_void + 0x290) != 0) {
    *(undefined8 *)((long)character_void + 0x290) = 0;
    pEVar1 = ESF::Get(*(ESF **)(*(long *)((long)character_void + 0x410) + 0x170),
                      (uint)*(ushort *)((long)character_void + 0x28a));
    if (pEVar1->id != 0) {
      if (*(int *)((long)character_void + 0x298) != 0) {
        Character::SpellAct((Character *)character_void);
        return;
      }
      *(undefined1 *)((long)character_void + 0x288) = 1;
    }
  }
  return;
}

Assistant:

void character_cast_spell(void *character_void)
{
	Character *character(static_cast<Character *>(character_void));

	if (!character->spell_event)
		return;

	character->spell_event = 0;

	const ESF_Data& spell = character->world->esf->Get(character->spell_id);

	if (spell.id == 0)
		return;

	if (character->spell_target != Character::TargetInvalid)
		character->SpellAct();
	else
		character->spell_ready = true;
}